

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<Replace>::relocate
          (QArrayDataPointer<Replace> *this,qsizetype offset,Replace **data)

{
  Replace *d_first;
  Replace *pRVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<Replace,long_long>(this->ptr,this->size,d_first);
  if (data != (Replace **)0x0) {
    pRVar1 = *data;
    if ((this->ptr <= pRVar1) && (pRVar1 < this->ptr + this->size)) {
      *data = pRVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }